

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

ssize_t __thiscall notch::io::CSVReader::read(CSVReader *this,int __fd,void *__buf,size_t __nbytes)

{
  value_type vVar1;
  bool bVar2;
  reference __x;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  float *pfVar7;
  undefined4 in_register_00000034;
  CSVReader *this_00;
  int in_R8D;
  int in_R9D;
  anon_class_16_2_b723ee91_for__M_pred __pred;
  ulong local_158;
  size_t i_2;
  Input data;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_138;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_130;
  const_iterator local_128;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_120;
  size_type local_118;
  int local_110;
  int *local_108;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_100;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_f8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> found;
  int i_1;
  size_t colIdx;
  size_t i;
  size_t ncols;
  Output label;
  vector<float,_std::allocator<float>_> row;
  iterator __end2;
  iterator __begin2;
  NumericTable *__range2;
  NumericTable numericRows;
  MixedTable mixedRows;
  undefined1 local_50 [8];
  TextTable rows;
  int skipcols_local;
  int skiprows_local;
  vector<int,_std::allocator<int>_> *labelcols_local;
  istream *in_local;
  CSVReader *this_local;
  LabeledDataset *ds;
  
  this_00 = (CSVReader *)CONCAT44(in_register_00000034,__fd);
  rows.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  core::LabeledDataset::LabeledDataset((LabeledDataset *)this);
  readCSV_abi_cxx11_((TextTable *)local_50,this_00,(istream *)__buf,in_R8D,in_R9D);
  convertToMixed((MixedTable *)
                 &numericRows.
                  super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00,(TextTable *)local_50);
  convertToNumeric((NumericTable *)&__range2,this_00,
                   (MixedTable *)
                   &numericRows.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  __end2 = core::std::
           vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
           ::begin((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)&__range2);
  row.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)core::std::
                vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ::end((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       *)&__range2);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
                                     *)&row.super__Vector_base<float,_std::allocator<float>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage), bVar2) {
    __x = __gnu_cxx::
          __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
          ::operator*(&__end2);
    core::std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&label._M_data,__x);
    sVar3 = core::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)__nbytes);
    core::std::valarray<float>::valarray((valarray<float> *)&ncols,sVar3);
    sVar3 = core::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&label._M_data);
    for (colIdx = 0;
        sVar4 = core::std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)__nbytes), colIdx < sVar4;
        colIdx = colIdx + 1) {
      pvVar5 = core::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)__nbytes,colIdx);
      pvVar6 = core::std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&label._M_data,
                          (sVar3 + (long)*pvVar5) % sVar3);
      vVar1 = *pvVar6;
      pfVar7 = core::std::valarray<float>::operator[]((valarray<float> *)&ncols,colIdx);
      *pfVar7 = vVar1;
    }
    sVar4 = core::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&label._M_data);
    found._M_current._4_4_ = (int)sVar4;
    while (found._M_current._4_4_ = found._M_current._4_4_ + -1, -1 < found._M_current._4_4_) {
      local_100._M_current =
           (int *)core::std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)__nbytes);
      local_108 = (int *)core::std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)__nbytes);
      local_110 = found._M_current._4_4_;
      __pred.i = found._M_current._4_4_;
      __pred.ncols = sVar3;
      __pred._12_4_ = 0;
      local_118 = sVar3;
      local_f8 = std::
                 find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,notch::io::CSVReader::read(std::istream&,std::vector<int,std::allocator<int>>,int,int)::_lambda(int)_1_>
                           (local_100,
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                            local_108,__pred);
      local_120._M_current =
           (int *)core::std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)__nbytes);
      bVar2 = __gnu_cxx::operator!=(&local_f8,&local_120);
      if (bVar2) {
        local_138._M_current =
             (float *)core::std::vector<float,_std::allocator<float>_>::begin
                                ((vector<float,_std::allocator<float>_> *)&label._M_data);
        local_130 = __gnu_cxx::
                    __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                    operator+(&local_138,(long)found._M_current._4_4_);
        __gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>::
        __normal_iterator<float*>
                  ((__normal_iterator<float_const*,std::vector<float,std::allocator<float>>> *)
                   &local_128,&local_130);
        data._M_data = (float *)core::std::vector<float,_std::allocator<float>_>::erase
                                          ((vector<float,_std::allocator<float>_> *)&label._M_data,
                                           local_128);
      }
    }
    sVar3 = core::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)&label._M_data);
    core::std::valarray<float>::valarray((valarray<float> *)&i_2,sVar3);
    for (local_158 = 0;
        sVar3 = core::std::vector<float,_std::allocator<float>_>::size
                          ((vector<float,_std::allocator<float>_> *)&label._M_data),
        local_158 < sVar3; local_158 = local_158 + 1) {
      pvVar6 = core::std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&label._M_data,local_158);
      vVar1 = *pvVar6;
      pfVar7 = core::std::valarray<float>::operator[]((valarray<float> *)&i_2,local_158);
      *pfVar7 = vVar1;
    }
    core::LabeledDataset::append((LabeledDataset *)this,(Input *)&i_2,(Output *)&ncols);
    core::std::valarray<float>::~valarray((valarray<float> *)&i_2);
    core::std::valarray<float>::~valarray((valarray<float> *)&ncols);
    core::std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)&label._M_data);
    __gnu_cxx::
    __normal_iterator<std::vector<float,_std::allocator<float>_>_*,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
    ::operator++(&__end2);
  }
  rows.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  core::std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)&__range2);
  core::std::
  vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
  ::~vector((vector<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>,_std::allocator<std::vector<notch::io::CSVReader::Cell,_std::allocator<notch::io::CSVReader::Cell>_>_>_>
             *)&numericRows.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  core::std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)local_50);
  if ((rows.
       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    core::LabeledDataset::~LabeledDataset((LabeledDataset *)this);
  }
  return (ssize_t)this;
}

Assistant:

LabeledDataset
    read(std::istream &in, std::vector<int> labelcols = {-1},
         int skiprows=0, int skipcols=0) {
        LabeledDataset ds;
        auto rows = readCSV(in, skiprows, skipcols);
        auto mixedRows = convertToMixed(rows);
        auto numericRows = convertToNumeric(mixedRows);
        for (auto row : numericRows) {
            // build label vector
            Output label(labelcols.size());
            size_t ncols = row.size();
            for (size_t i = 0; i < labelcols.size(); ++i) {
                size_t colIdx = ((ncols + labelcols[i]) % ncols);
                label[i] = row[colIdx];
            }
            // remove label columns from the row (from the end)
            for (int i = row.size()-1; i >= 0; --i) {
                auto found = std::find_if(labelcols.begin(), labelcols.end(),
                             [=](int labelcol) {
                                return (labelcol + ncols) % ncols == size_t(i);
                             });
                if (found != labelcols.end()) {
                    row.erase(row.begin() + i);
                }
            }
            // build data vector
            Input data(row.size());
            for (size_t i = 0; i < row.size(); ++i) {
                data[i] = row[i];
            }
            ds.append(data, label);
        }
        return ds;
    }